

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

void gguf_add_tensor(gguf_context *ctx,ggml_tensor *tensor)

{
  pointer *ppgVar1;
  uint64_t uVar2;
  int64_t iVar3;
  size_t sVar4;
  iterator __position;
  char *name;
  char *fmt;
  int line;
  gguf_tensor_info ti;
  gguf_tensor_info local_170;
  
  if (tensor == (ggml_tensor *)0x0) {
    fmt = "GGML_ASSERT(%s) failed";
    name = "tensor";
    line = 0x447;
  }
  else {
    name = tensor->name;
    iVar3 = gguf_find_tensor(ctx,name);
    if (iVar3 == -1) {
      memcpy(&local_170,tensor,0x150);
      __position._M_current =
           (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if ((ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
          _M_impl.super__Vector_impl_data._M_start == __position._M_current) {
        local_170.offset = 0;
      }
      else {
        uVar2 = __position._M_current[-1].offset;
        sVar4 = ggml_nbytes(&__position._M_current[-1].t);
        __position._M_current =
             (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_170.offset = (-ctx->alignment & (sVar4 + ctx->alignment) - 1) + uVar2;
      }
      if (__position._M_current ==
          (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<gguf_tensor_info,std::allocator<gguf_tensor_info>>::
        _M_realloc_insert<gguf_tensor_info_const&>
                  ((vector<gguf_tensor_info,std::allocator<gguf_tensor_info>> *)&ctx->info,
                   __position,&local_170);
      }
      else {
        memcpy(__position._M_current,&local_170,0x158);
        ppgVar1 = &(ctx->info).
                   super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppgVar1 = *ppgVar1 + 1;
      }
      return;
    }
    fmt = "duplicate tensor name: %s";
    line = 0x449;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",line,
             fmt,name);
}

Assistant:

void gguf_add_tensor(
             struct gguf_context * ctx,
        const struct ggml_tensor * tensor) {
    GGML_ASSERT(tensor);
    if (gguf_find_tensor(ctx, tensor->name) != -1) {
        GGML_ABORT("duplicate tensor name: %s", tensor->name);
    }

    struct gguf_tensor_info ti;
    ti.t = *tensor;
    ti.offset = ctx->info.empty() ? 0 :
        ctx->info.back().offset + GGML_PAD(ggml_nbytes(&ctx->info.back().t), ctx->alignment);
    ctx->info.push_back(ti);
}